

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# urlapi.c
# Opt level: O2

CURLUcode curl_url_get(CURLU *u,CURLUPart what,char **part,uint flags)

{
  char cVar1;
  char *pcVar2;
  char *pcVar3;
  int iVar4;
  CURLcode CVar5;
  CURLUcode CVar6;
  Curl_handler *pCVar7;
  size_t sVar8;
  char *pcVar9;
  char *pcVar10;
  size_t sVar11;
  char *pcVar12;
  char *pcVar13;
  byte bVar14;
  char *pcVar15;
  byte bVar16;
  char *pcVar18;
  char *pcVar19;
  char *pcVar20;
  char *scheme;
  char *pcVar21;
  char *pcVar22;
  char *pcVar23;
  char *pcVar24;
  char *pcVar25;
  char *pcVar26;
  bool bVar27;
  bool bVar28;
  size_t sStack_a0;
  char portbuf [7];
  size_t dlen;
  dynbuf enc;
  byte bVar17;
  
  if (u == (CURLU *)0x0) {
    return CURLUE_BAD_HANDLE;
  }
  if (part == (char **)0x0) {
    return CURLUE_BAD_PARTPOINTER;
  }
  *part = (char *)0x0;
  if (CURLUPART_ZONEID < what) {
    return CURLUE_UNKNOWN_PART;
  }
  bVar17 = (byte)flags;
  bVar16 = bVar17 >> 6;
  switch(what) {
  case CURLUPART_URL:
    pcVar9 = u->options;
    pcVar12 = u->port;
    if ((u->scheme != (char *)0x0) && (iVar4 = Curl_strcasecompare("file",u->scheme), iVar4 != 0)) {
      pcVar9 = u->fragment;
      pcVar12 = "#";
      if (pcVar9 == (char *)0x0) {
        pcVar12 = "";
        pcVar9 = "";
      }
      pcVar9 = curl_maprintf("file://%s%s%s",u->path,pcVar12,pcVar9);
      goto LAB_004a70f1;
    }
    if (u->host == (char *)0x0) {
      return CURLUE_NO_HOST;
    }
    scheme = u->scheme;
    if (scheme == (char *)0x0) {
      if ((flags & 4) == 0) {
        return CURLUE_NO_SCHEME;
      }
      scheme = "https";
    }
    pCVar7 = Curl_builtin_scheme(scheme,0xffffffffffffffff);
    if ((flags & 1) == 0 || pcVar12 != (char *)0x0) {
      if (pCVar7 == (Curl_handler *)0x0 || pcVar12 == (char *)0x0) {
        if (pCVar7 == (Curl_handler *)0x0) goto LAB_004a6ea4;
      }
      else {
        pcVar10 = (char *)0x0;
        if (u->portnum != (long)pCVar7->defport) {
          pcVar10 = pcVar12;
        }
        if ((flags & 2) != 0) {
          pcVar12 = pcVar10;
        }
      }
LAB_004a6e92:
      if ((pCVar7->flags & 0x400) == 0) {
        pcVar9 = (char *)0x0;
      }
    }
    else {
      if (pCVar7 != (Curl_handler *)0x0) {
        curl_msnprintf(portbuf,7,"%u",(ulong)(uint)pCVar7->defport);
        pcVar12 = portbuf;
        goto LAB_004a6e92;
      }
      pcVar12 = (char *)0x0;
    }
LAB_004a6ea4:
    pcVar10 = u->host;
    cVar1 = *pcVar10;
    if (cVar1 == '[') {
      if (u->zoneid == (char *)0x0) {
LAB_004a6f26:
        pcVar10 = (char *)0x0;
      }
      else {
        sVar8 = strlen(pcVar10);
        Curl_dyn_init(&enc,8000000);
        CVar5 = Curl_dyn_addf(&enc,"%.*s%%25%s]",(ulong)((int)sVar8 - 1),u->host,u->zoneid);
        if (CVar5 != CURLE_OK) {
          return CURLUE_OUT_OF_MEMORY;
        }
        pcVar10 = Curl_dyn_ptr(&enc);
      }
    }
    else {
      if (-1 < (char)bVar17) {
        while (pcVar10 = pcVar10 + 1, cVar1 != '\0') {
          if (cVar1 == '%') {
            Curl_dyn_init(&enc,8000000);
            pcVar10 = u->host;
            goto LAB_004a6f60;
          }
          cVar1 = *pcVar10;
        }
        goto LAB_004a6f26;
      }
      pcVar10 = curl_easy_escape((Curl_easy *)0x0,pcVar10,0);
      if (pcVar10 == (char *)0x0) {
        return CURLUE_OUT_OF_MEMORY;
      }
    }
LAB_004a6fb1:
    pcVar21 = u->password;
    bVar27 = pcVar21 == (char *)0x0;
    pcVar2 = "    :";
    pcVar3 = "    :";
    if (bVar27) {
      pcVar3 = "PK\x01\x02";
      pcVar21 = "";
    }
    bVar28 = pcVar9 == (char *)0x0;
    pcVar22 = ";";
    if (bVar28) {
      pcVar22 = "";
      pcVar9 = "";
    }
    pcVar23 = "@";
    if (bVar28) {
      pcVar23 = "";
    }
    if (!bVar27) {
      pcVar23 = "@";
    }
    pcVar13 = u->user;
    if (pcVar13 == (char *)0x0) {
      pcVar13 = "";
    }
    else {
      pcVar23 = "@";
    }
    pcVar19 = pcVar10;
    if (pcVar10 == (char *)0x0) {
      pcVar19 = u->host;
    }
    if (pcVar12 == (char *)0x0) {
      pcVar2 = "PK\x01\x02";
      pcVar12 = "";
    }
    pcVar18 = u->path;
    if (pcVar18 == (char *)0x0) {
      pcVar18 = "/";
      pcVar15 = "";
    }
    else {
      pcVar15 = "/";
      if (*pcVar18 == '/') {
        pcVar15 = "";
      }
    }
    pcVar25 = u->query;
    pcVar24 = "";
    pcVar20 = "";
    if ((pcVar25 != (char *)0x0) && (pcVar24 = "?", pcVar20 = pcVar25, *pcVar25 == '\0')) {
      pcVar24 = "";
      pcVar20 = "";
    }
    pcVar25 = u->fragment;
    pcVar26 = "#";
    if (pcVar25 == (char *)0x0) {
      pcVar26 = "";
      pcVar25 = "";
    }
    pcVar9 = curl_maprintf("%s://%s%s%s%s%s%s%s%s%s%s%s%s%s%s%s",scheme,pcVar13,pcVar3 + 4,pcVar21,
                           pcVar22,pcVar9,pcVar23,pcVar19,pcVar2 + 4,pcVar12,pcVar15,pcVar18,pcVar24
                           ,pcVar20,pcVar26,pcVar25);
    (*Curl_cfree)(pcVar10);
LAB_004a70f1:
    if (pcVar9 != (char *)0x0) {
      *part = pcVar9;
      return CURLUE_OK;
    }
    return CURLUE_OUT_OF_MEMORY;
  case CURLUPART_SCHEME:
    CVar6 = CURLUE_NO_SCHEME;
    bVar14 = 0;
    bVar16 = 0;
    goto LAB_004a6c78;
  case CURLUPART_USER:
    u = (CURLU *)&u->user;
    CVar6 = CURLUE_NO_USER;
    break;
  case CURLUPART_PASSWORD:
    u = (CURLU *)&u->password;
    CVar6 = CURLUE_NO_PASSWORD;
    break;
  case CURLUPART_OPTIONS:
    u = (CURLU *)&u->options;
    CVar6 = CURLUE_NO_OPTIONS;
    break;
  case CURLUPART_HOST:
    CVar6 = CURLUE_NO_HOST;
    u = (CURLU *)&u->host;
    break;
  case CURLUPART_PORT:
    pcVar9 = u->port;
    if ((flags & 1) == 0 || pcVar9 != (char *)0x0) {
      if (pcVar9 == (char *)0x0) {
        return CURLUE_NO_PORT;
      }
      if ((u->scheme == (char *)0x0) ||
         (pCVar7 = Curl_builtin_scheme(u->scheme,0xffffffffffffffff), pCVar7 == (Curl_handler *)0x0)
         ) {
        bVar16 = 0;
      }
      else {
        bVar16 = 0;
        if ((flags & 2) != 0) {
          bVar14 = 0;
          if (u->portnum == (long)pCVar7->defport) {
            return CURLUE_NO_PORT;
          }
          goto LAB_004a6d0f;
        }
      }
    }
    else {
      if (u->scheme == (char *)0x0) {
        return CURLUE_NO_PORT;
      }
      pCVar7 = Curl_builtin_scheme(u->scheme,0xffffffffffffffff);
      if (pCVar7 == (Curl_handler *)0x0) {
        return CURLUE_NO_PORT;
      }
      bVar16 = 0;
      pcVar9 = portbuf;
      curl_msnprintf(pcVar9,7,"%u");
    }
    goto LAB_004a6d0d;
  case CURLUPART_PATH:
    pcVar9 = u->path;
    if (pcVar9 == (char *)0x0) {
      pcVar9 = (*Curl_cstrdup)("/");
      u->path = pcVar9;
      if (pcVar9 == (char *)0x0) {
        return CURLUE_OUT_OF_MEMORY;
      }
    }
LAB_004a6d0d:
    bVar14 = 0;
    goto LAB_004a6d0f;
  case CURLUPART_QUERY:
    u = (CURLU *)&u->query;
    CVar6 = CURLUE_NO_QUERY;
    bVar14 = bVar16;
    goto LAB_004a6c78;
  case CURLUPART_FRAGMENT:
    u = (CURLU *)&u->fragment;
    CVar6 = CURLUE_NO_FRAGMENT;
    break;
  case CURLUPART_ZONEID:
    u = (CURLU *)&u->zoneid;
    CVar6 = CURLUE_NO_ZONEID;
  }
  bVar14 = 0;
LAB_004a6c78:
  pcVar9 = u->scheme;
  if (pcVar9 == (char *)0x0) {
    return CVar6;
  }
LAB_004a6d0f:
  sVar8 = strlen(pcVar9);
  pcVar9 = (char *)Curl_memdup(pcVar9,sVar8 + 1);
  *part = pcVar9;
  if (pcVar9 != (char *)0x0) {
    if ((bVar14 & 1) != 0) {
      for (sVar11 = 0; sVar8 != sVar11; sVar11 = sVar11 + 1) {
        if (pcVar9[sVar11] == '+') {
          pcVar9[sVar11] = ' ';
        }
      }
    }
    if ((bVar16 & 1) != 0) {
      CVar5 = Curl_urldecode(*part,0,&enc.bufr,&dlen,REJECT_CTRL);
      (*Curl_cfree)(*part);
      if (CVar5 != CURLE_OK) {
        *part = (char *)0x0;
        return CURLUE_URLDECODE;
      }
      *part = enc.bufr;
      sVar8 = dlen;
    }
    if (-1 < (char)bVar17) {
      return CURLUE_OK;
    }
    Curl_dyn_init(&enc,8000000);
    CVar6 = urlencode_str(&enc,*part,sVar8,true,what == CURLUPART_QUERY);
    if (CVar6 == CURLUE_OK) {
      (*Curl_cfree)(*part);
      pcVar9 = Curl_dyn_ptr(&enc);
      *part = pcVar9;
      return CURLUE_OK;
    }
  }
  return CURLUE_OUT_OF_MEMORY;
LAB_004a6f60:
  if (*pcVar10 == '%') {
    pcVar21 = "%25";
    sStack_a0 = 3;
  }
  else {
    if (*pcVar10 == '\0') {
      (*Curl_cfree)(u->host);
      pcVar10 = Curl_dyn_ptr(&enc);
      u->host = pcVar10;
      pcVar10 = (char *)0x0;
      goto LAB_004a6fb1;
    }
    sStack_a0 = 1;
    pcVar21 = pcVar10;
  }
  CVar5 = Curl_dyn_addn(&enc,pcVar21,sStack_a0);
  pcVar10 = pcVar10 + 1;
  if (CVar5 != CURLE_OK) {
    return CURLUE_OUT_OF_MEMORY;
  }
  goto LAB_004a6f60;
}

Assistant:

CURLUcode curl_url_get(CURLU *u, CURLUPart what,
                       char **part, unsigned int flags)
{
  char *ptr;
  CURLUcode ifmissing = CURLUE_UNKNOWN_PART;
  char portbuf[7];
  bool urldecode = (flags & CURLU_URLDECODE)?1:0;
  bool urlencode = (flags & CURLU_URLENCODE)?1:0;
  bool plusdecode = FALSE;
  (void)flags;
  if(!u)
    return CURLUE_BAD_HANDLE;
  if(!part)
    return CURLUE_BAD_PARTPOINTER;
  *part = NULL;

  switch(what) {
  case CURLUPART_SCHEME:
    ptr = u->scheme;
    ifmissing = CURLUE_NO_SCHEME;
    urldecode = FALSE; /* never for schemes */
    break;
  case CURLUPART_USER:
    ptr = u->user;
    ifmissing = CURLUE_NO_USER;
    break;
  case CURLUPART_PASSWORD:
    ptr = u->password;
    ifmissing = CURLUE_NO_PASSWORD;
    break;
  case CURLUPART_OPTIONS:
    ptr = u->options;
    ifmissing = CURLUE_NO_OPTIONS;
    break;
  case CURLUPART_HOST:
    ptr = u->host;
    ifmissing = CURLUE_NO_HOST;
    break;
  case CURLUPART_ZONEID:
    ptr = u->zoneid;
    ifmissing = CURLUE_NO_ZONEID;
    break;
  case CURLUPART_PORT:
    ptr = u->port;
    ifmissing = CURLUE_NO_PORT;
    urldecode = FALSE; /* never for port */
    if(!ptr && (flags & CURLU_DEFAULT_PORT) && u->scheme) {
      /* there's no stored port number, but asked to deliver
         a default one for the scheme */
      const struct Curl_handler *h =
        Curl_builtin_scheme(u->scheme, CURL_ZERO_TERMINATED);
      if(h) {
        msnprintf(portbuf, sizeof(portbuf), "%u", h->defport);
        ptr = portbuf;
      }
    }
    else if(ptr && u->scheme) {
      /* there is a stored port number, but ask to inhibit if
         it matches the default one for the scheme */
      const struct Curl_handler *h =
        Curl_builtin_scheme(u->scheme, CURL_ZERO_TERMINATED);
      if(h && (h->defport == u->portnum) &&
         (flags & CURLU_NO_DEFAULT_PORT))
        ptr = NULL;
    }
    break;
  case CURLUPART_PATH:
    ptr = u->path;
    if(!ptr) {
      ptr = u->path = strdup("/");
      if(!u->path)
        return CURLUE_OUT_OF_MEMORY;
    }
    break;
  case CURLUPART_QUERY:
    ptr = u->query;
    ifmissing = CURLUE_NO_QUERY;
    plusdecode = urldecode;
    break;
  case CURLUPART_FRAGMENT:
    ptr = u->fragment;
    ifmissing = CURLUE_NO_FRAGMENT;
    break;
  case CURLUPART_URL: {
    char *url;
    char *scheme;
    char *options = u->options;
    char *port = u->port;
    char *allochost = NULL;
    if(u->scheme && strcasecompare("file", u->scheme)) {
      url = aprintf("file://%s%s%s",
                    u->path,
                    u->fragment? "#": "",
                    u->fragment? u->fragment : "");
    }
    else if(!u->host)
      return CURLUE_NO_HOST;
    else {
      const struct Curl_handler *h = NULL;
      if(u->scheme)
        scheme = u->scheme;
      else if(flags & CURLU_DEFAULT_SCHEME)
        scheme = (char *) DEFAULT_SCHEME;
      else
        return CURLUE_NO_SCHEME;

      h = Curl_builtin_scheme(scheme, CURL_ZERO_TERMINATED);
      if(!port && (flags & CURLU_DEFAULT_PORT)) {
        /* there's no stored port number, but asked to deliver
           a default one for the scheme */
        if(h) {
          msnprintf(portbuf, sizeof(portbuf), "%u", h->defport);
          port = portbuf;
        }
      }
      else if(port) {
        /* there is a stored port number, but asked to inhibit if it matches
           the default one for the scheme */
        if(h && (h->defport == u->portnum) &&
           (flags & CURLU_NO_DEFAULT_PORT))
          port = NULL;
      }

      if(h && !(h->flags & PROTOPT_URLOPTIONS))
        options = NULL;

      if(u->host[0] == '[') {
        if(u->zoneid) {
          /* make it '[ host %25 zoneid ]' */
          struct dynbuf enc;
          size_t hostlen = strlen(u->host);
          Curl_dyn_init(&enc, CURL_MAX_INPUT_LENGTH);
          if(Curl_dyn_addf(&enc, "%.*s%%25%s]", (int)hostlen - 1, u->host,
                           u->zoneid))
            return CURLUE_OUT_OF_MEMORY;
          allochost = Curl_dyn_ptr(&enc);
        }
      }
      else if(urlencode) {
        allochost = curl_easy_escape(NULL, u->host, 0);
        if(!allochost)
          return CURLUE_OUT_OF_MEMORY;
      }
      else {
        /* only encode '%' in output host name */
        char *host = u->host;
        bool percent = FALSE;
        /* first, count number of percents present in the name */
        while(*host) {
          if(*host == '%') {
            percent = TRUE;
            break;
          }
          host++;
        }
        /* if there were percent(s), encode the host name */
        if(percent) {
          struct dynbuf enc;
          CURLcode result;
          Curl_dyn_init(&enc, CURL_MAX_INPUT_LENGTH);
          host = u->host;
          while(*host) {
            if(*host == '%')
              result = Curl_dyn_addn(&enc, "%25", 3);
            else
              result = Curl_dyn_addn(&enc, host, 1);
            if(result)
              return CURLUE_OUT_OF_MEMORY;
            host++;
          }
          free(u->host);
          u->host = Curl_dyn_ptr(&enc);
        }
      }

      url = aprintf("%s://%s%s%s%s%s%s%s%s%s%s%s%s%s%s%s",
                    scheme,
                    u->user ? u->user : "",
                    u->password ? ":": "",
                    u->password ? u->password : "",
                    options ? ";" : "",
                    options ? options : "",
                    (u->user || u->password || options) ? "@": "",
                    allochost ? allochost : u->host,
                    port ? ":": "",
                    port ? port : "",
                    (u->path && (u->path[0] != '/')) ? "/": "",
                    u->path ? u->path : "/",
                    (u->query && u->query[0]) ? "?": "",
                    (u->query && u->query[0]) ? u->query : "",
                    u->fragment? "#": "",
                    u->fragment? u->fragment : "");
      free(allochost);
    }
    if(!url)
      return CURLUE_OUT_OF_MEMORY;
    *part = url;
    return CURLUE_OK;
  }
  default:
    ptr = NULL;
    break;
  }
  if(ptr) {
    size_t partlen = strlen(ptr);
    size_t i = 0;
    *part = Curl_memdup(ptr, partlen + 1);
    if(!*part)
      return CURLUE_OUT_OF_MEMORY;
    if(plusdecode) {
      /* convert + to space */
      char *plus = *part;
      for(i = 0; i < partlen; ++plus, i++) {
        if(*plus == '+')
          *plus = ' ';
      }
    }
    if(urldecode) {
      char *decoded;
      size_t dlen;
      /* this unconditional rejection of control bytes is documented
         API behavior */
      CURLcode res = Curl_urldecode(*part, 0, &decoded, &dlen, REJECT_CTRL);
      free(*part);
      if(res) {
        *part = NULL;
        return CURLUE_URLDECODE;
      }
      *part = decoded;
      partlen = dlen;
    }
    if(urlencode) {
      struct dynbuf enc;
      Curl_dyn_init(&enc, CURL_MAX_INPUT_LENGTH);
      if(urlencode_str(&enc, *part, partlen, TRUE,
                       what == CURLUPART_QUERY))
        return CURLUE_OUT_OF_MEMORY;
      free(*part);
      *part = Curl_dyn_ptr(&enc);
    }

    return CURLUE_OK;
  }
  else
    return ifmissing;
}